

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O3

void __thiscall
HashtableTest_MaxSizeAndMaxBucketCount_Test::TestBody
          (HashtableTest_MaxSizeAndMaxBucketCount_Test *this)

{
  int *piVar1;
  char *pcVar2;
  sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)_h_>_> ht_104;
  sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__xff_>_> ht_char;
  sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ht_default;
  Hasher local_1d8;
  long *local_1c8;
  int local_1c0;
  Alloc<int,_unsigned_char,_(unsigned_char)_h_> local_1b8;
  SetKey local_1a2;
  SetKey local_1a1;
  undefined1 local_1a0 [8];
  int *local_198;
  vector<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_char,_(unsigned_char)_h_>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_char,_(unsigned_char)_h_>_>,_unsigned_char,_(unsigned_char)_h_>_>
  local_168;
  undefined1 local_128 [56];
  vector<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_char,_(unsigned_char)__xff_>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_char,_(unsigned_char)__xff_>_>,_unsigned_char,_(unsigned_char)__xff_>_>
  local_f0;
  sparse_hashtable<int,_int,_Hasher,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  local_b0;
  
  local_1a0 = (undefined1  [8])0x0;
  local_198 = (int *)((ulong)local_198 & 0xffffffff00000000);
  local_1b8.id_ = 0;
  local_1b8._4_4_ = 0;
  local_1b8.count_ = (int *)((ulong)local_1b8.count_ & 0xffffffff00000000);
  local_128._0_4_ = 0;
  local_128._8_8_ = (int *)0x0;
  google::
  sparse_hashtable<int,_int,_Hasher,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::sparse_hashtable(&local_b0,0,(Hasher *)local_1a0,(Hasher *)&local_1b8,(Identity *)&local_1c8,
                     (SetKey *)&local_1d8,
                     (Alloc<int,_unsigned_long,_18446744073709551615UL> *)local_128);
  local_1b8._0_8_ = 0;
  local_1b8.count_ = (int *)((ulong)local_1b8.count_ & 0xffffffff00000000);
  local_1c8 = (long *)0x0;
  local_1c0 = 0;
  local_1a0 = (undefined1  [8])((ulong)local_1a0 & 0xffffffff00000000);
  local_198 = (int *)0x0;
  google::
  sparse_hashtable<int,_int,_Hasher,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)'\xff'>_>::Identity,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)'\xff'>_>::SetKey,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)'\xff'>_>
  ::sparse_hashtable((sparse_hashtable<int,_int,_Hasher,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__xff_>_>::Identity,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__xff_>_>::SetKey,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)__xff_>_>
                      *)local_128,'\0',(Hasher *)&local_1b8,(Hasher *)&local_1c8,
                     (Identity *)&local_1d8,&local_1a2,
                     (Alloc<int,_unsigned_char,_(unsigned_char)__xff_> *)local_1a0);
  local_1c8 = (long *)0x0;
  local_1c0 = 0;
  local_1d8.id_ = 0;
  local_1d8.num_hashes_ = 0;
  local_1d8.num_compares_ = 0;
  local_1b8._0_8_ = local_1b8._0_8_ & 0xffffffff00000000;
  local_1b8.count_ = (int *)0x0;
  google::
  sparse_hashtable<int,_int,_Hasher,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)'h'>_>::Identity,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)'h'>_>::SetKey,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)'h'>_>
  ::sparse_hashtable((sparse_hashtable<int,_int,_Hasher,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)_h_>_>::Identity,_google::sparse_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)_h_>_>::SetKey,_Hasher,_Alloc<int,_unsigned_char,_(unsigned_char)_h_>_>
                      *)local_1a0,'\0',(Hasher *)&local_1c8,&local_1d8,(Identity *)&local_1a2,
                     &local_1a1,&local_1b8);
  local_1c8 = (long *)0xffffffffffffffff;
  local_1d8.id_ = 0x100;
  testing::internal::CmpHelperGE<unsigned_long,unsigned_int>
            ((internal *)&local_1b8,"ht_default.max_size()","256u",(unsigned_long *)&local_1c8,
             (uint *)&local_1d8);
  if ((char)local_1b8.id_ == '\0') {
    testing::Message::Message((Message *)&local_1c8);
    if (local_1b8.count_ == (int *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_1b8.count_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x22d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1d8,(Message *)&local_1c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1d8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8 !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*local_1c8 + 8))();
    }
  }
  piVar1 = local_1b8.count_;
  if (local_1b8.count_ != (int *)0x0) {
    if (*(int **)local_1b8.count_ != local_1b8.count_ + 4) {
      operator_delete(*(int **)local_1b8.count_);
    }
    operator_delete(piVar1);
  }
  local_1c8 = (long *)CONCAT44(local_1c8._4_4_,0xff);
  local_1d8.id_._0_1_ = 0xff;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_char>
            ((internal *)&local_1b8,"255u","ht_char.max_size()",(uint *)&local_1c8,
             (uchar *)&local_1d8);
  if ((char)local_1b8.id_ == '\0') {
    testing::Message::Message((Message *)&local_1c8);
    if (local_1b8.count_ == (int *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_1b8.count_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x22e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1d8,(Message *)&local_1c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1d8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8 !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*local_1c8 + 8))();
    }
  }
  piVar1 = local_1b8.count_;
  if (local_1b8.count_ != (int *)0x0) {
    if (*(int **)local_1b8.count_ != local_1b8.count_ + 4) {
      operator_delete(*(int **)local_1b8.count_);
    }
    operator_delete(piVar1);
  }
  local_1c8 = (long *)CONCAT44(local_1c8._4_4_,0x68);
  local_1d8.id_._0_1_ = 0x68;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_char>
            ((internal *)&local_1b8,"104u","ht_104.max_size()",(uint *)&local_1c8,
             (uchar *)&local_1d8);
  if ((char)local_1b8.id_ == '\0') {
    testing::Message::Message((Message *)&local_1c8);
    if (local_1b8.count_ == (int *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_1b8.count_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x22f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1d8,(Message *)&local_1c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1d8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8 !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*local_1c8 + 8))();
    }
  }
  piVar1 = local_1b8.count_;
  if (local_1b8.count_ != (int *)0x0) {
    if (*(int **)local_1b8.count_ != local_1b8.count_ + 4) {
      operator_delete(*(int **)local_1b8.count_);
    }
    operator_delete(piVar1);
  }
  local_1c8 = (long *)0xffffffffffffffff;
  local_1d8.id_ = -1;
  local_1d8.num_hashes_ = -1;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&local_1b8,"ht_default.max_size()","ht_default.max_bucket_count()",
             (unsigned_long *)&local_1c8,(unsigned_long *)&local_1d8);
  if ((char)local_1b8.id_ == '\0') {
    testing::Message::Message((Message *)&local_1c8);
    if (local_1b8.count_ == (int *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_1b8.count_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x232,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1d8,(Message *)&local_1c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1d8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8 !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*local_1c8 + 8))();
    }
  }
  piVar1 = local_1b8.count_;
  if (local_1b8.count_ != (int *)0x0) {
    if (*(int **)local_1b8.count_ != local_1b8.count_ + 4) {
      operator_delete(*(int **)local_1b8.count_);
    }
    operator_delete(piVar1);
  }
  local_1c8 = (long *)CONCAT71(local_1c8._1_7_,0xff);
  local_1d8.id_._0_1_ = 0xff;
  testing::internal::CmpHelperEQ<unsigned_char,unsigned_char>
            ((internal *)&local_1b8,"ht_char.max_size()","ht_char.max_bucket_count()",
             (uchar *)&local_1c8,(uchar *)&local_1d8);
  if ((char)local_1b8.id_ == '\0') {
    testing::Message::Message((Message *)&local_1c8);
    if (local_1b8.count_ == (int *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_1b8.count_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x233,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1d8,(Message *)&local_1c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1d8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8 !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*local_1c8 + 8))();
    }
  }
  piVar1 = local_1b8.count_;
  if (local_1b8.count_ != (int *)0x0) {
    if (*(int **)local_1b8.count_ != local_1b8.count_ + 4) {
      operator_delete(*(int **)local_1b8.count_);
    }
    operator_delete(piVar1);
  }
  local_1c8 = (long *)CONCAT71(local_1c8._1_7_,0x68);
  local_1d8.id_._0_1_ = 0x68;
  testing::internal::CmpHelperEQ<unsigned_char,unsigned_char>
            ((internal *)&local_1b8,"ht_104.max_size()","ht_104.max_bucket_count()",
             (uchar *)&local_1c8,(uchar *)&local_1d8);
  if ((char)local_1b8.id_ == '\0') {
    testing::Message::Message((Message *)&local_1c8);
    if (local_1b8.count_ == (int *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_1b8.count_;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_1d8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x234,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_1d8,(Message *)&local_1c8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_1d8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8 !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*local_1c8 + 8))();
    }
  }
  piVar1 = local_1b8.count_;
  if (local_1b8.count_ != (int *)0x0) {
    if (*(int **)local_1b8.count_ != local_1b8.count_ + 4) {
      operator_delete(*(int **)local_1b8.count_);
    }
    operator_delete(piVar1);
  }
  std::
  vector<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_char,_(unsigned_char)'h'>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_char,_(unsigned_char)'h'>_>,_unsigned_char,_(unsigned_char)'h'>_>
  ::~vector(&local_168);
  std::
  vector<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_char,_(unsigned_char)'\xff'>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_char,_(unsigned_char)'\xff'>_>,_unsigned_char,_(unsigned_char)'\xff'>_>
  ::~vector(&local_f0);
  std::
  vector<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<int,_(unsigned_short)48,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
  ::~vector(&local_b0.table.groups);
  return;
}

Assistant:

TEST(HashtableTest, MaxSizeAndMaxBucketCount) {
  // The max size depends on the allocator.  So we can't use the
  // built-in allocator type; instead, we make our own types.
  sparse_hash_set<int, Hasher, Hasher, Alloc<int>> ht_default;
  sparse_hash_set<int, Hasher, Hasher, Alloc<int, unsigned char>> ht_char;
  sparse_hash_set<int, Hasher, Hasher, Alloc<int, unsigned char, 104>> ht_104;

  EXPECT_GE(ht_default.max_size(), 256u);
  EXPECT_EQ(255u, ht_char.max_size());
  EXPECT_EQ(104u, ht_104.max_size());

  // In our implementations, MaxBucketCount == MaxSize.
  EXPECT_EQ(ht_default.max_size(), ht_default.max_bucket_count());
  EXPECT_EQ(ht_char.max_size(), ht_char.max_bucket_count());
  EXPECT_EQ(ht_104.max_size(), ht_104.max_bucket_count());
}